

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

_Bool run_container_iterate64
                (run_container_t *cont,uint32_t base,roaring_iterator64 iterator,uint64_t high_bits,
                void *ptr)

{
  int iVar1;
  _Bool _Var2;
  long lVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  for (lVar3 = 0; iVar1 = cont->n_runs, lVar3 < iVar1; lVar3 = lVar3 + 1) {
    lVar5 = (ulong)cont->runs[lVar3].length + 1;
    uVar4 = cont->runs[lVar3].value + base;
    while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
      _Var2 = (*iterator)(uVar4 | high_bits,ptr);
      uVar4 = uVar4 + 1;
      if (!_Var2) goto LAB_001143da;
    }
  }
LAB_001143da:
  return iVar1 <= lVar3;
}

Assistant:

bool run_container_iterate64(const run_container_t *cont, uint32_t base,
                             roaring_iterator64 iterator, uint64_t high_bits,
                             void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(high_bits | (uint64_t)(run_start + j), ptr))
                return false;
    }
    return true;
}